

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert::queryX(LinearExpert *this,X *x)

{
  XZ *dst;
  XX *this_00;
  double dVar1;
  Scalar __x;
  Scal SVar2;
  ResScalar RVar3;
  double dVar4;
  X dx;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_68;
  void *local_40 [2];
  
  if (this->recompute == true) {
    dst = &this->PsiLambda;
    local_68.m_lhs = &this->invPsi;
    local_68.m_rhs.m_lhs.m_lhs = &this->Lambda;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>>
              (dst,(Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
                    *)&local_68);
    local_68.m_lhs = (LhsNested)&this->Lambda;
    local_68.m_rhs.m_lhs.m_lhs = dst;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              (&this->LambdaPsiLambda,
               (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                *)&local_68);
    local_68.m_lhs = (LhsNested)&this->invSigma;
    local_68.m_rhs.m_lhs.m_lhs = &this->LambdaPsiLambda;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              (&this->pred_z_invVar,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&local_68);
    local_68.m_lhs = (LhsNested)&this->pred_z_invVar;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              (&this->pred_z_var,(Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_68);
    this_00 = &this->p_x_invVar;
    local_68.m_lhs = (LhsNested)dst;
    local_68.m_rhs.m_lhs.m_rhs.m_matrix = &this->pred_z_var;
    local_68.m_rhs.m_rhs = (RhsNested)dst;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
              (this_00,(Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                        *)&local_68);
    local_68.m_lhs = &this->invPsi;
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
               &local_68);
    __x = Eigen::internal::determinant_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>::run
                    (this_00);
    if (__x < 0.0) {
      SVar2 = sqrt(__x);
    }
    else {
      SVar2 = SQRT(__x);
    }
    this->p_x_invVarSqrtDet = SVar2;
    this->recompute = false;
  }
  local_68.m_rhs.m_lhs.m_lhs = (LhsNested)&this->Mu;
  local_68.m_lhs = x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_68);
  local_68.m_lhs = &this->Nu;
  local_68.m_rhs.m_lhs.m_rhs.m_matrix = &this->PsiLambda;
  local_68.m_rhs.m_lhs.m_lhs = &this->pred_z_var;
  local_68.m_rhs.m_rhs = (RhsNested)local_40;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (&this->pred_z,&local_68);
  dVar1 = this->p_x_invVarSqrtDet;
  local_68.m_lhs = (LhsNested)&this->p_x_invVar;
  local_68.m_rhs.m_lhs.m_lhs = (LhsNested)local_40;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                 *)&local_68);
  dVar4 = exp(RVar3 * -0.5);
  dVar4 = dVar4 * dVar1;
  this->p_x_Norm = dVar4;
  free(local_40[0]);
  return dVar4;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryX( X const &x )
{
    if( recompute )
    {
        PsiLambda = invPsi.asDiagonal() * Lambda;
        LambdaPsiLambda = Lambda.transpose() * PsiLambda;

        // Observation Variance
        pred_z_invVar = invSigma + LambdaPsiLambda;
        pred_z_var = pred_z_invVar.inverse();                      //TODO: Optimize this!

        p_x_invVar = - PsiLambda * pred_z_var * PsiLambda.transpose();
        p_x_invVar += invPsi.asDiagonal();
        p_x_invVarSqrtDet = sqrt(p_x_invVar.determinant());        //TODO: Optimize this!

        // Prediction Variance
//        pred_z_var_factor = pred_z_var * LambdaPsiLambda * pred_z_var;
//        if( wNu == 0.0 )
//            pred_z_var *= 1.0/Sh;
//        else
//        {
//            Z dz = Nu - Sz/Sh;
//            pred_z_var *= 1.0/Sh + dz.dot( varLambda * dz );
//        }

        recompute = false;
    }

    X dx = x - Mu;

    pred_z = Nu + pred_z_var * PsiLambda.transpose() * dx;
    p_x_Norm = p_x_invVarSqrtDet * exp( -0.5 * dx.dot(p_x_invVar * dx) );

    return p_x_Norm;
}